

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Gla2Fla(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *pGVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  char *pcVar6;
  
  bVar3 = false;
  Extra_UtilGetoptReset();
  while (iVar4 = Extra_UtilGetopt(argc,argv,"vh"), iVar4 == 0x76) {
    bVar3 = (bool)(bVar3 ^ 1);
  }
  if (iVar4 == -1) {
    pGVar1 = pAbc->pGia;
    if (pGVar1 == (Gia_Man_t *)0x0) {
      pcVar6 = "Abc_CommandAbc9Gla2Fla(): There is no AIG.\n";
    }
    else {
      if (pGVar1->vGateClasses != (Vec_Int_t *)0x0) {
        if (pGVar1->vFlopClasses != (Vec_Int_t *)0x0) {
          piVar2 = pGVar1->vFlopClasses->pArray;
          if (piVar2 != (int *)0x0) {
            free(piVar2);
            pGVar1->vFlopClasses->pArray = (int *)0x0;
          }
          if (pGVar1->vFlopClasses != (Vec_Int_t *)0x0) {
            free(pGVar1->vFlopClasses);
            pGVar1->vFlopClasses = (Vec_Int_t *)0x0;
          }
        }
        pVVar5 = Gia_GlaConvertToFla(pAbc->pGia,pAbc->pGia->vGateClasses);
        pGVar1 = pAbc->pGia;
        pGVar1->vFlopClasses = pVVar5;
        if (pGVar1->vGateClasses == (Vec_Int_t *)0x0) {
          return 0;
        }
        piVar2 = pGVar1->vGateClasses->pArray;
        if (piVar2 != (int *)0x0) {
          free(piVar2);
          pGVar1->vGateClasses->pArray = (int *)0x0;
        }
        if (pGVar1->vGateClasses == (Vec_Int_t *)0x0) {
          return 0;
        }
        free(pGVar1->vGateClasses);
        pGVar1->vGateClasses = (Vec_Int_t *)0x0;
        return 0;
      }
      pcVar6 = "Abc_CommandAbc9Gla2Fla(): There is no gate-level abstraction is defined.\n";
    }
    iVar4 = 0;
    Abc_Print(-1,pcVar6);
  }
  else {
    Abc_Print(-2,"usage: &gla_fla [-vh]\n");
    Abc_Print(-2,"\t          maps gate-level into flop-level abstraction\n");
    pcVar6 = "yes";
    if (!bVar3) {
      pcVar6 = "no";
    }
    Abc_Print(-2,"\t-v      : toggle printing verbose information [default = %s]\n",pcVar6);
    Abc_Print(-2,"\t-h      : print the command usage\n");
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int Abc_CommandAbc9Gla2Fla( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Gla2Fla(): There is no AIG.\n" );
        return 0;
    }
    if ( pAbc->pGia->vGateClasses == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Gla2Fla(): There is no gate-level abstraction is defined.\n" );
        return 0;
    }
    Vec_IntFreeP( &pAbc->pGia->vFlopClasses );
    pAbc->pGia->vFlopClasses = Gia_GlaConvertToFla( pAbc->pGia, pAbc->pGia->vGateClasses );
    Vec_IntFreeP( &pAbc->pGia->vGateClasses );
    return 0;

usage:
    Abc_Print( -2, "usage: &gla_fla [-vh]\n" );
    Abc_Print( -2, "\t          maps gate-level into flop-level abstraction\n" );
    Abc_Print( -2, "\t-v      : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}